

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
insert(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
      vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
      *siblings)

{
  size_t sVar1;
  unit_t *puVar2;
  int *piVar3;
  bool bVar4;
  uint *puVar5;
  ulong uVar6;
  size_t sVar7;
  pointer pnVar8;
  ulong uVar9;
  pointer pnVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  new_siblings;
  long local_50;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  local_48;
  
  if (this->error_ < 0) {
LAB_0013b92a:
    sVar14 = 0;
  }
  else {
    uVar12 = (ulong)((siblings->
                     super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                     )._M_impl.super__Vector_impl_data._M_start)->code + 1;
    if (uVar12 <= this->next_check_pos_) {
      uVar12 = this->next_check_pos_;
    }
    if (this->alloc_size_ <= uVar12 - 1) {
      resize(this,uVar12);
    }
    local_50 = 0;
    bVar4 = false;
    uVar12 = uVar12 - 1;
    do {
      do {
        while( true ) {
          uVar9 = uVar12;
          uVar12 = uVar9 + 1;
          if (this->alloc_size_ <= uVar12) {
            resize(this,uVar9 + 2);
          }
          if (this->array_[uVar9 + 1].check == 0) break;
          local_50 = local_50 + 1;
        }
        if (!bVar4) {
          this->next_check_pos_ = uVar12;
        }
        sVar14 = uVar12 - ((siblings->
                           super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                           )._M_impl.super__Vector_impl_data._M_start)->code;
        uVar6 = this->alloc_size_;
        if (uVar6 <= (siblings->
                     super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].code + sVar14) {
          auVar17._8_4_ = (int)(uVar6 >> 0x20);
          auVar17._0_8_ = uVar6;
          auVar17._12_4_ = 0x45300000;
          sVar7 = this->key_size_;
          auVar18._8_4_ = (int)(sVar7 >> 0x20);
          auVar18._0_8_ = sVar7;
          auVar18._12_4_ = 0x45300000;
          sVar1 = this->progress_;
          auVar19._8_4_ = (int)(sVar1 >> 0x20);
          auVar19._0_8_ = sVar1;
          auVar19._12_4_ = 0x45300000;
          dVar22 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) /
                   ((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
          dVar16 = 1.05;
          if (1.05 <= dVar22) {
            dVar16 = dVar22;
          }
          dVar16 = dVar16 * ((auVar17._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
          uVar6 = (ulong)dVar16;
          resize(this,(long)(dVar16 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
        }
        bVar4 = true;
      } while (this->used_[sVar14] != '\0');
      pnVar10 = (siblings->
                super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(siblings->
                    super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar10 >> 5;
      bVar15 = uVar6 >= 2;
      if (uVar6 < 2) break;
      if (this->array_[sVar14 + pnVar10[1].code].check == 0) {
        pnVar10 = pnVar10 + 2;
        uVar13 = 1;
        do {
          if ((2 - uVar6) + uVar13 == 1) goto LAB_0013b788;
          puVar5 = &pnVar10->code;
          pnVar10 = pnVar10 + 1;
          uVar13 = uVar13 + 1;
        } while (this->array_[sVar14 + *puVar5].check == 0);
        bVar15 = uVar13 < uVar6;
      }
    } while (bVar15);
LAB_0013b788:
    auVar20._8_4_ = (int)((ulong)local_50 >> 0x20);
    auVar20._0_8_ = local_50;
    auVar20._12_4_ = 0x45300000;
    lVar11 = (uVar9 - this->next_check_pos_) + 2;
    auVar21._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar21._0_8_ = lVar11;
    auVar21._12_4_ = 0x45300000;
    if (0.95 <= ((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) /
                ((auVar21._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0))) {
      this->next_check_pos_ = uVar12;
    }
    this->used_[sVar14] = '\x01';
    pnVar10 = (siblings->
              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar12 = (pnVar10[-1].code + 1) + sVar14;
    if (uVar12 < this->size_) {
      uVar12 = this->size_;
    }
    pnVar8 = (siblings->
             super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
             )._M_impl.super__Vector_impl_data._M_start;
    this->size_ = uVar12;
    lVar11 = (long)pnVar10 - (long)pnVar8;
    if (lVar11 != 0) {
      puVar2 = this->array_;
      lVar11 = lVar11 >> 5;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      do {
        puVar2[sVar14 + pnVar8->code].check = (uint)sVar14;
        pnVar8 = pnVar8 + 1;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    pnVar10 = (siblings->
              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((siblings->
        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
        )._M_impl.super__Vector_impl_data._M_finish != pnVar10) {
      lVar11 = 0;
      uVar12 = 0;
      do {
        local_48.
        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sVar7 = fetch(this,(node_t *)((long)&pnVar10->code + lVar11),&local_48);
        if (sVar7 == 0) {
          piVar3 = this->value_;
          uVar9 = *(ulong *)((long)&((siblings->
                                     super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->left + lVar11);
          if (piVar3 != (int *)0x0) {
            uVar9 = (ulong)(uint)piVar3[uVar9];
          }
          pnVar10 = (siblings->
                    super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          this->array_[sVar14 + *(uint *)((long)&pnVar10->code + lVar11)].base = ~(uint)uVar9;
          if ((piVar3 != (int *)0x0) && (piVar3[*(long *)((long)&pnVar10->left + lVar11)] < 0)) {
            this->error_ = -2;
            if (local_48.
                super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.
                              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_0013b92a;
          }
          sVar7 = this->progress_ + 1;
          this->progress_ = sVar7;
          if (this->progress_func_ != (_func_int_size_t_size_t *)0x0) {
            (*this->progress_func_)(sVar7,this->key_size_);
          }
        }
        else {
          sVar7 = insert(this,&local_48);
          this->array_
          [sVar14 + *(uint *)((long)&((siblings->
                                      super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->code + lVar11)].
          base = (int)sVar7;
        }
        if (local_48.
            super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar12 = uVar12 + 1;
        pnVar10 = (siblings->
                  super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x20;
      } while (uVar12 < (ulong)((long)(siblings->
                                      super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar10 >>
                               5));
    }
  }
  return sVar14;
}

Assistant:

size_t insert(const std::vector <node_t> &siblings) {
    if (error_ < 0) return 0;

    size_t begin = 0;
    size_t pos   = _max((size_t)siblings[0].code + 1, next_check_pos_) - 1;
    size_t nonzero_num = 0;
    int    first = 0;

    if (alloc_size_ <= pos) resize(pos + 1);

    while (true) {
   next:
      ++pos;

      if (alloc_size_ <= pos) resize(pos + 1);

      if (array_[pos].check) {
        ++nonzero_num;
        continue;
      } else if (!first) {
        next_check_pos_ = pos;
        first = 1;
      }

      begin = pos - siblings[0].code;
      if (alloc_size_ <= (begin + siblings[siblings.size()-1].code))
        resize(static_cast<size_t>(alloc_size_ *
                                   _max(1.05, 1.0 * key_size_ / progress_)));

      if (used_[begin]) continue;

      for (size_t i = 1; i < siblings.size(); ++i)
        if (array_[begin + siblings[i].code].check != 0) goto next;

      break;
    }

    // -- Simple heuristics --
    // if the percentage of non-empty contents in check between the index
    // 'next_check_pos' and 'check' is greater than some constant
    // value(e.g. 0.9),
    // new 'next_check_pos' index is written by 'check'.
    if (1.0 * nonzero_num/(pos - next_check_pos_ + 1) >= 0.95)
      next_check_pos_ = pos;

    used_[begin] = 1;
    size_ = _max(size_,
                 begin +
                 static_cast<size_t>(siblings[siblings.size() - 1].code + 1));

    for (size_t i = 0; i < siblings.size(); ++i)
      array_[begin + siblings[i].code].check = begin;

    for (size_t i = 0; i < siblings.size(); ++i) {
      std::vector <node_t> new_siblings;

      if (!fetch(siblings[i], new_siblings)) {
        array_[begin + siblings[i].code].base =
            value_ ?
            static_cast<array_type_>(-value_[siblings[i].left]-1) :
            static_cast<array_type_>(-siblings[i].left-1);

        if (value_ && (array_type_)(-value_[siblings[i].left]-1) >= 0) {
          error_ = -2;
          return 0;
        }

        ++progress_;
        if (progress_func_)(*progress_func_)(progress_, key_size_);

      } else {
        size_t h = insert(new_siblings);
        array_[begin + siblings[i].code].base = h;
      }
    }

    return begin;
  }